

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          OutputWriter *a_oOutput,bool a_bAddSignature)

{
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *plVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _List_node_base *p_Var5;
  ulong uVar7;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *plVar8;
  SI_Error SVar9;
  _List_node_base *p_Var10;
  char *pcVar11;
  TNamesDepend oValues;
  TNamesDepend oSections;
  Converter convert;
  TNamesDepend oKeys;
  _List_node_base local_a8;
  undefined8 local_98;
  _List_node_base local_90;
  undefined8 local_80;
  _List_node_base *local_78;
  Converter local_70;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *local_48;
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  *local_40;
  undefined8 local_38;
  _List_node_base *p_Var6;
  
  Converter::Converter(&local_70,this->m_bStoreIsUtf8);
  if ((a_bAddSignature & this->m_bStoreIsUtf8) == 1) {
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,anon_var_dwarf_148b8);
  }
  local_90._M_next = &local_90;
  local_80 = 0;
  local_90._M_prev = local_90._M_next;
  GetAllSections(this,(TNamesDepend *)local_90._M_next);
  p_Var10 = &local_90;
  std::__cxx11::
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>
            ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
              *)p_Var10);
  if (this->m_pFileComment == (char *)0x0) {
    bVar4 = false;
  }
  else {
    bVar3 = OutputMultiLineText(this,a_oOutput,&local_70,this->m_pFileComment);
    SVar9 = SI_FAIL;
    bVar4 = true;
    if (!bVar3) goto LAB_0018bd44;
  }
  do {
    p_Var10 = p_Var10->_M_next;
    if (p_Var10 == &local_90) {
      SVar9 = SI_OK;
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      goto LAB_0018bd44;
    }
    p_Var5 = p_Var10[1]._M_prev;
    if (p_Var5 == (_List_node_base *)0x0) {
      if (bVar4) {
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        goto LAB_0018ba65;
      }
    }
    else {
      if (bVar4) {
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        p_Var5 = p_Var10[1]._M_prev;
      }
      bVar4 = OutputMultiLineText(this,a_oOutput,&local_70,(char *)p_Var5);
      if (!bVar4) break;
LAB_0018ba65:
      bVar4 = false;
    }
    p_Var5 = p_Var10[1]._M_next;
    if (*(char *)&p_Var5->_M_next != '\0') {
      bVar3 = Converter::ConvertToStore(&local_70,(char *)p_Var5);
      if (!bVar3) break;
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"[");
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,local_70.m_scratch._M_dataplus._M_p);
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"]");
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      p_Var5 = p_Var10[1]._M_next;
    }
    local_38 = 0;
    local_48 = (list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                *)&local_48;
    local_40 = (list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                *)&local_48;
    GetAllKeys(this,(char *)p_Var5,(TNamesDepend *)&local_48);
    std::__cxx11::
    list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
    ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>
              ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                *)&local_48);
    local_78 = p_Var10;
    plVar8 = local_48;
    if (local_48 ==
        (list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
         *)&local_48) {
      bVar3 = true;
      p_Var10 = local_78;
      plVar1 = local_48;
      bVar2 = true;
    }
    else {
      do {
        p_Var10 = &local_a8;
        local_98 = 0;
        local_a8._M_next = p_Var10;
        local_a8._M_prev = p_Var10;
        GetAllValues(this,(char *)local_78[1]._M_next,*(char **)(plVar8 + 0x10),
                     (TNamesDepend *)p_Var10);
        while (p_Var10 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                            *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var10 != &local_a8) {
          if (p_Var10[1]._M_prev != (_List_node_base *)0x0) {
            (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
            bVar3 = OutputMultiLineText(this,a_oOutput,&local_70,(char *)p_Var10[1]._M_prev);
            if (bVar3) goto LAB_0018bb77;
LAB_0018bcc4:
            p_Var10 = local_a8._M_next;
            while (p_Var10 != &local_a8) {
              p_Var5 = p_Var10->_M_next;
              operator_delete(p_Var10);
              p_Var10 = p_Var5;
            }
            bVar3 = false;
            p_Var10 = local_78;
            plVar1 = local_48;
            bVar2 = bVar4;
            goto joined_r0x0018bcfa;
          }
LAB_0018bb77:
          bVar3 = Converter::ConvertToStore(&local_70,*(char **)(plVar8 + 0x10));
          if (!bVar3) goto LAB_0018bcc4;
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,local_70.m_scratch._M_dataplus._M_p);
          bVar3 = Converter::ConvertToStore(&local_70,(char *)p_Var10[1]._M_next);
          if (!bVar3) goto LAB_0018bcc4;
          pcVar11 = "=";
          if (this->m_bSpaces != false) {
            pcVar11 = " = ";
          }
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar11);
          if (this->m_bAllowMultiLine == true) {
            p_Var5 = p_Var10[1]._M_next;
            uVar7 = (ulong)*(byte *)&p_Var5->_M_next;
            if (uVar7 < 0x21) {
              if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
                if (uVar7 == 0) goto LAB_0018bc3a;
                goto LAB_0018bc5b;
              }
            }
            else {
LAB_0018bc5b:
              while (p_Var6 = (_List_node_base *)((long)&p_Var5->_M_next + 1), (char)uVar7 != '\0')
              {
                if (((int)uVar7 == 10) || ((int)uVar7 == 0xd)) goto LAB_0018bbf7;
                p_Var5 = p_Var6;
                uVar7 = (ulong)*(byte *)&p_Var6->_M_next;
              }
              uVar7 = (ulong)*(byte *)((long)&p_Var5[-1]._M_prev + 7);
              if ((0x20 < uVar7) || ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0)) goto LAB_0018bc3a;
            }
LAB_0018bbf7:
            (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"<<<END_OF_TEXT\n");
            bVar3 = OutputMultiLineText(this,a_oOutput,&local_70,(char *)p_Var10[1]._M_next);
            if (!bVar3) goto LAB_0018bcc4;
            (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"END_OF_TEXT");
          }
          else {
LAB_0018bc3a:
            (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,local_70.m_scratch._M_dataplus._M_p);
          }
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        }
        p_Var10 = local_a8._M_next;
        while (p_Var10 != &local_a8) {
          p_Var5 = p_Var10->_M_next;
          operator_delete(p_Var10);
          p_Var10 = p_Var5;
        }
        plVar8 = *(list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                   **)plVar8;
        bVar3 = true;
        p_Var10 = local_78;
        plVar1 = local_48;
        bVar2 = true;
      } while (plVar8 != (list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                          *)&local_48);
    }
joined_r0x0018bcfa:
    while (bVar4 = bVar2, local_78 = p_Var10,
          plVar1 != (list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                     *)&local_48) {
      plVar8 = *(list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                 **)plVar1;
      operator_delete(plVar1);
      p_Var10 = local_78;
      plVar1 = plVar8;
      bVar2 = bVar4;
    }
  } while (bVar3);
  SVar9 = SI_FAIL;
LAB_0018bd44:
  p_Var10 = local_90._M_next;
  while (p_Var10 != &local_90) {
    p_Var5 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var10);
    p_Var10 = p_Var5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_scratch._M_dataplus._M_p != &local_70.m_scratch.field_2) {
    operator_delete(local_70.m_scratch._M_dataplus._M_p);
  }
  return SVar9;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::Save(OutputWriter &a_oOutput, bool a_bAddSignature) const {
	Converter convert(m_bStoreIsUtf8);

	// add the UTF-8 signature if it is desired
	if (m_bStoreIsUtf8 && a_bAddSignature) {
		a_oOutput.Write(SI_UTF8_SIGNATURE);
	}

	// get all of the sections sorted in load order
	TNamesDepend oSections;
	GetAllSections(oSections);
#if defined(_MSC_VER) && _MSC_VER <= 1200
	oSections.sort();
#elif defined(__BORLANDC__)
	oSections.sort(Entry::LoadOrder());
#else
	oSections.sort(typename Entry::LoadOrder());
#endif

	// write the file comment if we have one
	bool bNeedNewLine = false;
	if (m_pFileComment) {
		if (!OutputMultiLineText(a_oOutput, convert, m_pFileComment)) {
			return SI_FAIL;
		}
		bNeedNewLine = true;
	}

	// iterate through our sections and output the data
	typename TNamesDepend::const_iterator iSection = oSections.begin();
	for (; iSection != oSections.end(); ++iSection) {
		// write out the comment if there is one
		if (iSection->pComment) {
			if (bNeedNewLine) {
				a_oOutput.Write(SI_NEWLINE_A);
				a_oOutput.Write(SI_NEWLINE_A);
			}
			if (!OutputMultiLineText(a_oOutput, convert, iSection->pComment)) {
				return SI_FAIL;
			}
			bNeedNewLine = false;
		}

		if (bNeedNewLine) {
			a_oOutput.Write(SI_NEWLINE_A);
			a_oOutput.Write(SI_NEWLINE_A);
			bNeedNewLine = false;
		}

		// write the section (unless there is no section name)
		if (*iSection->pItem) {
			if (!convert.ConvertToStore(iSection->pItem)) {
				return SI_FAIL;
			}
			a_oOutput.Write("[");
			a_oOutput.Write(convert.Data());
			a_oOutput.Write("]");
			a_oOutput.Write(SI_NEWLINE_A);
		}

		// get all of the keys sorted in load order
		TNamesDepend oKeys;
		GetAllKeys(iSection->pItem, oKeys);
#if defined(_MSC_VER) && _MSC_VER <= 1200
		oKeys.sort();
#elif defined(__BORLANDC__)
		oKeys.sort(Entry::LoadOrder());
#else
		oKeys.sort(typename Entry::LoadOrder());
#endif

		// write all keys and values
		typename TNamesDepend::const_iterator iKey = oKeys.begin();
		for (; iKey != oKeys.end(); ++iKey) {
			// get all values for this key
			TNamesDepend oValues;
			GetAllValues(iSection->pItem, iKey->pItem, oValues);

			typename TNamesDepend::const_iterator iValue = oValues.begin();
			for (; iValue != oValues.end(); ++iValue) {
				// write out the comment if there is one
				if (iValue->pComment) {
					a_oOutput.Write(SI_NEWLINE_A);
					if (!OutputMultiLineText(a_oOutput, convert, iValue->pComment)) {
						return SI_FAIL;
					}
				}

				// write the key
				if (!convert.ConvertToStore(iKey->pItem)) {
					return SI_FAIL;
				}
				a_oOutput.Write(convert.Data());

				// write the value
				if (!convert.ConvertToStore(iValue->pItem)) {
					return SI_FAIL;
				}
				a_oOutput.Write(m_bSpaces ? " = " : "=");
				if (m_bAllowMultiLine && IsMultiLineData(iValue->pItem)) {
					// multi-line data needs to be processed specially to ensure
					// that we use the correct newline format for the current system
					a_oOutput.Write("<<<END_OF_TEXT" SI_NEWLINE_A);
					if (!OutputMultiLineText(a_oOutput, convert, iValue->pItem)) {
						return SI_FAIL;
					}
					a_oOutput.Write("END_OF_TEXT");
				} else {
					a_oOutput.Write(convert.Data());
				}
				a_oOutput.Write(SI_NEWLINE_A);
			}
		}

		bNeedNewLine = true;
	}

	// Append new empty line
	a_oOutput.Write(SI_NEWLINE_A);

	return SI_OK;
}